

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall vm::VM::T2T<int,unsigned_char>(VM *this)

{
  byte bVar1;
  int iVar2;
  
  ensureStackUsed(this,1);
  iVar2 = this->_sp;
  this->_sp = iVar2 + -1;
  bVar1 = *(byte *)((this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t
                    .super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl + (long)iVar2 + -1);
  ensureStackRest(this,1);
  iVar2 = this->_sp;
  this->_sp = iVar2 + 1;
  (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl[iVar2] = (uint)bVar1;
  return;
}

Assistant:

void VM::T2T() {
    // static_assert(std::is_arithmetic_v<T1> && std::is_arithmetic_v<T2>);
    static_assert(!std::is_same_v<T1, T2>);
    PUSH(static_cast<T2>(POP<T1>()));
}